

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O0

String * __thiscall LiteScript::Character::operator*=(Character *this,uint nb)

{
  String *pSVar1;
  char32_t *pcVar2;
  uint local_68;
  uint j;
  undefined1 local_58 [8];
  String cpy;
  String res;
  uint nb_local;
  Character *this_local;
  
  String::String((String *)((long)&cpy.str.field_2 + 8));
  pcVar2 = String::operator[](this->str,this->i);
  String::String((String *)local_58,*pcVar2);
  for (local_68 = 0; local_68 < nb; local_68 = local_68 + 1) {
    String::operator+=((String *)((long)&cpy.str.field_2 + 8),(String *)local_58);
  }
  String::Replace(this->str,this->i,(String *)((long)&cpy.str.field_2 + 8));
  pSVar1 = this->str;
  String::~String((String *)local_58);
  String::~String((String *)((long)&cpy.str.field_2 + 8));
  return pSVar1;
}

Assistant:

LiteScript::String& LiteScript::Character::operator*=(unsigned int nb) {
    String res, cpy(this->str[this->i]);
    for (unsigned int j = 0; j < nb; j++)
        res += cpy;
    this->str.Replace(this->i, res);
    return this->str;
}